

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacCom.c
# Opt level: O0

int Bac_CommandCec(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Bac_Man_t *pBVar2;
  FILE *__stream;
  Gia_Man_t *p0;
  Gia_Man_t *p1;
  char *pcVar3;
  FILE *pFile;
  int fDumpMiter;
  int nArgcNew;
  int c;
  char **pArgvNew;
  char *pStr;
  char *FileName;
  Vec_Ptr_t *vDes;
  Cec_ParCec_t *pPars;
  Cec_ParCec_t ParsCec;
  Gia_Man_t *pMiter;
  Gia_Man_t *pSecond;
  Gia_Man_t *pFirst;
  Bac_Man_t *p;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pBVar2 = Bac_AbcGetMan(pAbc);
  Cec_ManCecSetDefaultParams((Cec_ParCec_t *)((long)&pPars + 4));
  Extra_UtilGetoptReset();
  while( true ) {
    iVar1 = Extra_UtilGetopt(argc,argv,"vh");
    if (iVar1 == -1) {
      if (pBVar2 == (Bac_Man_t *)0x0) {
        Abc_Print(1,"Bac_CommandCec(): There is no current design.\n");
        pAbc_local._4_4_ = 0;
      }
      else {
        if (argc - globalUtilOptind == 1) {
          pStr = argv[globalUtilOptind];
        }
        else {
          if (pBVar2->pSpec == (char *)0x0) {
            Abc_Print(-1,"File name is not given on the command line.\n");
            return 1;
          }
          pStr = pBVar2->pSpec;
        }
        for (pArgvNew = (char **)pStr; *(char *)pArgvNew != '\0';
            pArgvNew = (char **)((long)pArgvNew + 1)) {
          if (*(char *)pArgvNew == '>') {
            *(undefined1 *)pArgvNew = 0x5c;
          }
        }
        __stream = fopen(pStr,"r");
        if (__stream == (FILE *)0x0) {
          Abc_Print(-1,"Cannot open input file \"%s\". ",pStr);
          pcVar3 = Extra_FileGetSimilarName(pStr,".v",".blif",(char *)0x0,(char *)0x0,(char *)0x0);
          if (pcVar3 != (char *)0x0) {
            Abc_Print(1,"Did you mean \"%s\"?",pcVar3);
          }
          Abc_Print(1,"\n");
          pAbc_local._4_4_ = 1;
        }
        else {
          fclose(__stream);
          p0 = Bac_ManExtract(pBVar2,0,0);
          if (p0 == (Gia_Man_t *)0x0) {
            Abc_Print(-1,"Extracting AIG from the current design has failed.\n");
            pAbc_local._4_4_ = 0;
          }
          else {
            pcVar3 = Extra_FileNameExtension(pStr);
            iVar1 = strcmp(pcVar3,"blif");
            if (iVar1 == 0) {
              FileName = (char *)Psr_ManReadBlif(pStr);
            }
            else {
              pcVar3 = Extra_FileNameExtension(pStr);
              iVar1 = strcmp(pcVar3,"v");
              if (iVar1 != 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacCom.c"
                              ,0x27c,"int Bac_CommandCec(Abc_Frame_t *, int, char **)");
              }
              FileName = (char *)Psr_ManReadVerilog(pStr);
            }
            pBVar2 = Psr_ManBuildCba(pStr,(Vec_Ptr_t *)FileName);
            Psr_ManVecFree((Vec_Ptr_t *)FileName);
            p1 = Bac_ManExtract(pBVar2,0,0);
            Bac_ManFree(pBVar2);
            if (p1 == (Gia_Man_t *)0x0) {
              Gia_ManStop(p0);
              Abc_Print(-1,"Extracting AIG from the original design has failed.\n");
              pAbc_local._4_4_ = 0;
            }
            else {
              ParsCec._28_8_ = Gia_ManMiter(p0,p1,0,1,0,0,ParsCec.fSilent);
              if ((Gia_Man_t *)ParsCec._28_8_ != (Gia_Man_t *)0x0) {
                iVar1 = Cec_ManVerify((Gia_Man_t *)ParsCec._28_8_,(Cec_ParCec_t *)((long)&pPars + 4)
                                     );
                pAbc->Status = iVar1;
                Gia_ManStop((Gia_Man_t *)ParsCec._28_8_);
              }
              Gia_ManStop(p0);
              Gia_ManStop(p1);
              pAbc_local._4_4_ = 0;
            }
          }
        }
      }
      return pAbc_local._4_4_;
    }
    if ((iVar1 == 0x68) || (iVar1 != 0x76)) break;
    ParsCec.fSilent = ParsCec.fSilent ^ 1;
  }
  Abc_Print(-2,"usage: @_cec [-vh]\n");
  Abc_Print(-2,"\t         combinational equivalence checking\n");
  pcVar3 = "no";
  if (ParsCec.fSilent != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Bac_CommandCec( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Bac_Man_t * p = Bac_AbcGetMan(pAbc);
    Gia_Man_t * pFirst, * pSecond, * pMiter;
    Cec_ParCec_t ParsCec, * pPars = &ParsCec;
    Vec_Ptr_t * vDes;
    char * FileName, * pStr, ** pArgvNew;
    int c, nArgcNew, fDumpMiter = 0;
    FILE * pFile;
    Cec_ManCecSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( p == NULL )
    {
        Abc_Print( 1, "Bac_CommandCec(): There is no current design.\n" );
        return 0;
    }
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        if ( p->pSpec == NULL )
        {
            Abc_Print( -1, "File name is not given on the command line.\n" );
            return 1;
        }
        FileName = p->pSpec;
    }
    else
        FileName = pArgvNew[0];
    // fix the wrong symbol
    for ( pStr = FileName; *pStr; pStr++ )
        if ( *pStr == '>' )
            *pStr = '\\';
    if ( (pFile = fopen( FileName, "r" )) == NULL )
    {
        Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
        if ( (FileName = Extra_FileGetSimilarName( FileName, ".v", ".blif", NULL, NULL, NULL )) )
            Abc_Print( 1, "Did you mean \"%s\"?", FileName );
        Abc_Print( 1, "\n" );
        return 1;
    }
    fclose( pFile );

    // extract AIG from the current design
    pFirst = Bac_ManExtract( p, 0, 0 );
    if ( pFirst == NULL )
    {
        Abc_Print( -1, "Extracting AIG from the current design has failed.\n" );
        return 0;
    }
    // extract AIG from the second design
    if ( !strcmp( Extra_FileNameExtension(FileName), "blif" )  )
        vDes = Psr_ManReadBlif( FileName );
    else if ( !strcmp( Extra_FileNameExtension(FileName), "v" )  )
        vDes = Psr_ManReadVerilog( FileName );
    else assert( 0 );
    p = Psr_ManBuildCba( FileName, vDes );
    Psr_ManVecFree( vDes );
    pSecond = Bac_ManExtract( p, 0, 0 );
    Bac_ManFree( p );
    if ( pSecond == NULL )
    {
        Gia_ManStop( pFirst );
        Abc_Print( -1, "Extracting AIG from the original design has failed.\n" );
        return 0;
    }
    // compute the miter
    pMiter = Gia_ManMiter( pFirst, pSecond, 0, 1, 0, 0, pPars->fVerbose );
    if ( pMiter )
    {
        if ( fDumpMiter )
        {
            Abc_Print( 0, "The verification miter is written into file \"%s\".\n", "cec_miter.aig" );
            Gia_AigerWrite( pMiter, "cec_miter.aig", 0, 0, 0 );
        }
        pAbc->Status = Cec_ManVerify( pMiter, pPars );
        //Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexComb );
        Gia_ManStop( pMiter );
    }
    Gia_ManStop( pFirst );
    Gia_ManStop( pSecond );
    return 0;
usage:
    Abc_Print( -2, "usage: @_cec [-vh]\n" );
    Abc_Print( -2, "\t         combinational equivalence checking\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}